

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.cpp
# Opt level: O0

int find_children_proc(Am_Object *self)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  Am_Value *pAVar4;
  Am_Object local_50 [8];
  Am_Object item;
  Am_Object local_38 [8];
  Am_Value_List local_30 [8];
  Am_Value_List nodes;
  int local_20;
  int children;
  int rank;
  Am_Object *self_local;
  
  pAVar4 = (Am_Value *)Am_Object::Get((ushort)self,0x85);
  iVar2 = Am_Value::operator_cast_to_int(pAVar4);
  local_20 = 0;
  Am_Object::Get_Owner(local_38,(Am_Slot_Flags)self);
  pAVar4 = (Am_Value *)Am_Object::Get((ushort)local_38,0x82);
  Am_Value_List::Am_Value_List(local_30,pAVar4);
  Am_Object::~Am_Object(local_38);
  Am_Value_List::Start();
  while (bVar1 = Am_Value_List::Last(), ((bVar1 ^ 0xff) & 1) != 0) {
    pAVar4 = (Am_Value *)Am_Value_List::Get();
    Am_Object::Am_Object(local_50,pAVar4);
    pAVar4 = (Am_Value *)Am_Object::Get((ushort)local_50,(ulong)PARENT);
    iVar3 = Am_Value::operator_cast_to_int(pAVar4);
    if ((iVar3 == iVar2) && (bVar1 = Am_Object::operator!=(local_50,self), (bVar1 & 1) != 0)) {
      pAVar4 = (Am_Value *)Am_Object::Get((ushort)local_50,(ulong)CHILDREN);
      iVar3 = Am_Value::operator_cast_to_int(pAVar4);
      local_20 = iVar3 + local_20;
    }
    Am_Object::~Am_Object(local_50);
    Am_Value_List::Next();
  }
  if (local_20 == 0) {
    self_local._4_4_ = 1;
  }
  else {
    self_local._4_4_ = local_20;
  }
  Am_Value_List::~Am_Value_List(local_30);
  return self_local._4_4_;
}

Assistant:

Am_Define_Formula(int, find_children)
{
  int rank = self.Get(Am_RANK);
  int children = 0;
  Am_Value_List nodes = self.Get_Owner().Get(Am_GRAPHICAL_PARTS);
  for (nodes.Start(); !nodes.Last(); nodes.Next()) {
    Am_Object item = nodes.Get();
    if ((int)item.Get(PARENT) == rank && item != self)
      children += (int)item.Get(CHILDREN);
  }
  if (children)
    return children;
  else
    return 1;
}